

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O3

Data128 __thiscall Centaurus::pack_charclass(Centaurus *this,CharClass<char> *cc)

{
  long lVar1;
  int i;
  ulong uVar2;
  char cVar3;
  long lVar4;
  Data128 d128;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    if (uVar2 < (ulong)((long)cc - (long)this >> 4)) {
      if (this[lVar1 * 8 + 8] == this[lVar1 * 8 + 9]) goto LAB_001201aa;
      cVar3 = (char)this[lVar1 * 8 + 9] + -1;
      *(Centaurus *)(d128.sb + lVar1) = this[lVar1 * 8 + 8];
      lVar4 = lVar1;
    }
    else {
LAB_001201aa:
      d128.sb[lVar1] = -1;
      cVar3 = '\0';
      lVar4 = uVar2 * 2;
    }
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 2;
    d128.sb[lVar4 + 1] = cVar3;
    if (uVar2 == 8) {
      return d128;
    }
  } while( true );
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<char>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 8; i++)
    {
        if (cc[i].empty())
        {
            d128.ub[i * 2 + 0] = 0xFF;
            d128.ub[i * 2 + 1] = 0;
        }
        else
        {
            d128.ub[i * 2 + 0] = cc[i].start();
            d128.ub[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}